

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
EqualsFailure::EqualsFailure
          (EqualsFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *expected,SimpleString *actual,SimpleString *text)

{
  SimpleString *in_RCX;
  TestFailure *in_RDX;
  TestFailure *in_RSI;
  SimpleString *in_RDI;
  size_t in_R8;
  SimpleString *in_stack_ffffffffffffffa0;
  SimpleString *in_stack_ffffffffffffffa8;
  SimpleString *in_stack_ffffffffffffffb0;
  TestFailure *in_stack_ffffffffffffffb8;
  
  TestFailure::TestFailure(in_RSI,(UtestShell *)in_RDX,(char *)in_RCX,in_R8);
  in_RDI->buffer_ = (char *)&PTR__EqualsFailure_001ca830;
  TestFailure::createUserText(in_RDX,in_RCX);
  SimpleString::operator=(in_stack_ffffffffffffffa0,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17e9a1);
  TestFailure::createButWasString
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  SimpleString::operator+=(in_stack_ffffffffffffffa0,in_RDI);
  SimpleString::~SimpleString((SimpleString *)0x17e9d9);
  return;
}

Assistant:

EqualsFailure::EqualsFailure(UtestShell* test, const char* fileName, size_t lineNumber, const SimpleString& expected, const SimpleString& actual, const SimpleString& text)
    : TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(expected, actual);
}